

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O1

void __thiscall
mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::AlgebraicConstraint
          (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *this,LinTerms *le,AlgConRange rr,
          bool fSort)

{
  undefined3 in_register_00000011;
  
  (this->super_BasicConstraint).name_._M_dataplus._M_p =
       (pointer)&(this->super_BasicConstraint).name_.field_2;
  (this->super_BasicConstraint).name_._M_string_length = 0;
  (this->super_BasicConstraint).name_.field_2._M_local_buf[0] = '\0';
  gch::detail::small_vector_base<std::allocator<double>,_6U>::move_initialize<6U,_nullptr>
            ((small_vector_base<std::allocator<double>,_6U> *)&this->super_LinTerms,
             (small_vector_base<std::allocator<double>,_6U> *)le);
  gch::detail::small_vector_base<std::allocator<int>,_6U>::move_initialize<6U,_nullptr>
            (&(this->super_LinTerms).vars_.super_small_vector_base<std::allocator<int>,_6U>,
             &(le->vars_).super_small_vector_base<std::allocator<int>,_6U>);
  (this->super_AlgConRange).lb_ = rr.lb_;
  (this->super_AlgConRange).ub_ = rr.ub_;
  if (CONCAT31(in_register_00000011,fSort) != 0) {
    LinTerms::sort_terms(&this->super_LinTerms,true);
  }
  return;
}

Assistant:

AlgebraicConstraint(Body le, RhsOrRange rr, bool fSort=true)
    : Body(std::move(le)), RhsOrRange(std::move(rr))
  { if (fSort) sort_terms(); }